

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
finishedWithValue(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,int index)

{
  bool bVar1;
  _Self local_40 [3];
  _Self local_28;
  iterator fnd;
  lock_guard<std::mutex> lock;
  int index_local;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  lock._M_device._4_4_ = index;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&fnd,&this->promiseLock);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::find(&this->usedPromiseByInteger,(key_type *)((long)&lock._M_device + 4));
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end(&this->usedPromiseByInteger);
  bVar1 = std::operator!=(&local_28,local_40);
  if (bVar1) {
    std::
    map<int,std::promise<std::__cxx11::string>,std::less<int>,std::allocator<std::pair<int_const,std::promise<std::__cxx11::string>>>>
    ::erase_abi_cxx11_((map<int,std::promise<std::__cxx11::string>,std::less<int>,std::allocator<std::pair<int_const,std::promise<std::__cxx11::string>>>>
                        *)&this->usedPromiseByInteger,(iterator)local_28._M_node);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&fnd);
  return;
}

Assistant:

void finishedWithValue(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = usedPromiseByInteger.find(index);
        if (fnd != usedPromiseByInteger.end()) {
            usedPromiseByInteger.erase(fnd);
        }
    }